

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCount.h
# Opt level: O2

SmartPtr<AsyncEventAgent> * __thiscall
SmartPtr<AsyncEventAgent>::operator=(SmartPtr<AsyncEventAgent> *this,AsyncEventAgent *obj)

{
  if (obj != (AsyncEventAgent *)0x0) {
    RefCount::AddRef((RefCount *)obj);
  }
  if ((RefCount *)this->mObj != (RefCount *)0x0) {
    RefCount::Release((RefCount *)this->mObj);
  }
  this->mObj = obj;
  return this;
}

Assistant:

SmartPtr &operator=( T *obj )	
	{ 
		//printf( "SmartPtr = start\n" );
		if ( obj != NULL)
		{
			obj->AddRef();
		}

		if ( mObj != NULL )
			mObj->Release();
		mObj = obj;
		
		//printf( "SmartPtr = stop\n" );
		return *this;
	}